

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_tag_t mpack_read_tag(mpack_reader_t *reader)

{
  size_t sVar1;
  ulong uVar2;
  mpack_tag_t mVar3;
  mpack_tag_t tag;
  
  if (reader->error != mpack_ok) {
    return (mpack_tag_t)(ZEXT816(1) << 0x40);
  }
  tag.v.u = 0;
  tag.type = 0;
  tag._12_4_ = 0;
  sVar1 = mpack_parse_tag(reader,&tag);
  if (sVar1 == 0) {
    uVar2 = 1;
    tag.v.u = 0;
  }
  else {
    reader->data = reader->data + sVar1;
    uVar2 = tag._8_8_ & 0xffffffff;
  }
  mVar3._8_8_ = uVar2;
  mVar3.v.u = tag.v.u;
  return mVar3;
}

Assistant:

mpack_tag_t mpack_read_tag(mpack_reader_t* reader) {
    mpack_log("reading tag\n");

    // make sure we can read a tag
    if (mpack_reader_error(reader) != mpack_ok)
        return mpack_tag_nil();
    if (mpack_reader_track_element(reader) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;
    size_t count = mpack_parse_tag(reader, &tag);
    if (count == 0)
        return mpack_tag_nil();

    #if MPACK_READ_TRACKING
    mpack_error_t track_error = mpack_ok;

    switch (tag.type) {
        case mpack_type_map:
        case mpack_type_array:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.l);
            break;
        case mpack_type_str:
        case mpack_type_bin:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.n);
            break;
        case mpack_type_ext:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.ext.length);
            break;
        default:
            break;
    }

    if (track_error != mpack_ok) {
        mpack_reader_flag_error(reader, track_error);
        return mpack_tag_nil();
    }
    #endif

    reader->data += count;
    return tag;
}